

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  cmStateSnapshot local_28;
  
  cmState::CreateVariableScopeSnapshot
            (&local_28,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&this->StateSnapshot);
  (this->StateSnapshot).Position.Position = local_28.Position.Position;
  (this->StateSnapshot).State = (cmState *)CONCAT44(local_28.State._4_4_,local_28.State._0_4_);
  (this->StateSnapshot).Position.Tree = local_28.Position.Tree;
  local_28.State._0_4_ = 0;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->LoopBlockCounter).c,(int *)&local_28);
  cmFileLockPool::PushFunctionScope(&this->GlobalGenerator->FileLockPool);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  this->StateSnapshot =
    this->GetState()->CreateVariableScopeSnapshot(this->StateSnapshot);
  this->PushLoopBlockBarrier();

#if !defined(CMAKE_BOOTSTRAP)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}